

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_code.cpp
# Opt level: O0

void Init(void)

{
  allocator local_31;
  string local_30 [39];
  string local_9;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"r_code",&local_31);
  debug(&local_9);
  DebugStream::operator<<((DebugStream *)&local_9,"r_code library loaded");
  DebugStream::~DebugStream((DebugStream *)&local_9);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void Init()
{
    debug("r_code") << "r_code library loaded";
}